

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# civil_time_detail.h
# Opt level: O0

diff_t absl::lts_20250127::time_internal::cctz::detail::impl::day_difference
                 (year_t y1,month_t m1,day_t d1,year_t y2,month_t m2,day_t d2)

{
  diff_t dVar1;
  diff_t dVar2;
  long local_48;
  diff_t delta;
  diff_t c4_diff;
  diff_t b_c4_off;
  diff_t a_c4_off;
  day_t d2_local;
  month_t m2_local;
  year_t y2_local;
  day_t d1_local;
  month_t m1_local;
  year_t y1_local;
  
  delta = (y1 - y1 % 400) - (y2 - y2 % 400);
  dVar1 = ymd_ord(y1 % 400,m1,d1);
  dVar2 = ymd_ord(y2 % 400,m2,d2);
  local_48 = dVar1 - dVar2;
  if ((delta < 1) || (-1 < local_48)) {
    if ((delta < 0) && (0 < local_48)) {
      local_48 = local_48 + -0x47562;
      delta = delta + 800;
    }
  }
  else {
    local_48 = local_48 + 0x47562;
    delta = delta + -800;
  }
  return (delta / 400) * 0x23ab1 + local_48;
}

Assistant:

CONSTEXPR_F diff_t day_difference(year_t y1, month_t m1, day_t d1, year_t y2,
                                  month_t m2, day_t d2) noexcept {
  const diff_t a_c4_off = y1 % 400;
  const diff_t b_c4_off = y2 % 400;
  diff_t c4_diff = (y1 - a_c4_off) - (y2 - b_c4_off);
  diff_t delta = ymd_ord(a_c4_off, m1, d1) - ymd_ord(b_c4_off, m2, d2);
  if (c4_diff > 0 && delta < 0) {
    delta += 2 * 146097;
    c4_diff -= 2 * 400;
  } else if (c4_diff < 0 && delta > 0) {
    delta -= 2 * 146097;
    c4_diff += 2 * 400;
  }
  return (c4_diff / 400 * 146097) + delta;
}